

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,CallExpression *expression)

{
  undefined1 *puVar1;
  pointer ppEVar2;
  vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_> *pvVar3;
  Expression *pEVar4;
  pointer ppEVar5;
  ulong uVar6;
  
  pvVar3 = CallExpression::getArguments(expression);
  pEVar4 = CallExpression::getExpression(expression);
  (**(pEVar4->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar4,this);
  puVar1 = &this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"(",1);
  ppEVar5 = (pvVar3->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (pvVar3->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar5) {
    uVar6 = 0;
    if ((long)ppEVar2 - (long)ppEVar5 != 8) {
      do {
        (**(ppEVar5[uVar6]->super_Statement).super_ASTNode._vptr_ASTNode)(ppEVar5[uVar6],this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", ",2);
        uVar6 = uVar6 + 1;
        ppEVar5 = (pvVar3->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < ((long)(pvVar3->
                              super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3) - 1U
              );
    }
    (**(ppEVar5[uVar6]->super_Statement).super_ASTNode._vptr_ASTNode)(ppEVar5[uVar6],this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,")",1);
  return;
}

Assistant:

void PrettyPrinter::visit(CallExpression* expression) {
    int i;
    std::vector<Expression*>& arguments = expression->getArguments();

    expression->getExpression()->accept(this);
    output << "(";

    if (arguments.size() > 0) {
        for (i = 0; i < arguments.size() - 1; ++i) {
            arguments[i]->accept(this);
            output << ", ";
        }

        arguments[i]->accept(this);
    }

    output << ")";
}